

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::~list
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this_local;
  
  clear(this);
  listTerminate(this);
  allocator<ft::listNode<ft::pair<int,_int>_>_>::~allocator
            ((allocator<ft::listNode<ft::pair<int,_int>_>_> *)&this->field_0x18);
  return;
}

Assistant:

~list() {
		this->clear();
		this->listTerminate();
	}